

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int array_container_try_add(array_container_t *arr,uint16_t value,int32_t max_cardinality)

{
  uint uVar1;
  uint16_t *array;
  int lenarray;
  
  lenarray = arr->cardinality;
  if ((long)lenarray == 0) {
    if (max_cardinality < 1) {
      array = arr->array;
      goto LAB_00102f65;
    }
  }
  else {
    array = arr->array;
    if ((max_cardinality <= lenarray) || (value <= array[(long)lenarray + -1])) {
LAB_00102f65:
      uVar1 = binarySearch(array,lenarray,value);
      if (-1 < (int)uVar1) {
        return 0;
      }
      if (lenarray < max_cardinality) {
        if (arr->cardinality == arr->capacity) {
          array_container_grow(arr,arr->cardinality + 1,true);
        }
        uVar1 = ~uVar1;
        memmove(arr->array + (ulong)uVar1 + 1,arr->array + uVar1,(long)(int)(lenarray - uVar1) * 2);
        arr->array[uVar1] = value;
        arr->cardinality = arr->cardinality + 1;
        return 1;
      }
      return -1;
    }
  }
  if (lenarray == arr->capacity) {
    array_container_grow(arr,lenarray + 1,true);
    lenarray = arr->cardinality;
  }
  arr->cardinality = lenarray + 1;
  arr->array[lenarray] = value;
  return 1;
}

Assistant:

static inline int array_container_try_add(array_container_t *arr,
                                          uint16_t value,
                                          int32_t max_cardinality) {
    const int32_t cardinality = arr->cardinality;

    // best case, we can append.
    if ((array_container_empty(arr) || arr->array[cardinality - 1] < value) &&
        cardinality < max_cardinality) {
        array_container_append(arr, value);
        return 1;
    }

    const int32_t loc = binarySearch(arr->array, cardinality, value);

    if (loc >= 0) {
        return 0;
    } else if (cardinality < max_cardinality) {
        if (array_container_full(arr)) {
            array_container_grow(arr, arr->capacity + 1, true);
        }
        const int32_t insert_idx = -loc - 1;
        memmove(arr->array + insert_idx + 1, arr->array + insert_idx,
                (cardinality - insert_idx) * sizeof(uint16_t));
        arr->array[insert_idx] = value;
        arr->cardinality++;
        return 1;
    } else {
        return -1;
    }
}